

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

int32_t __thiscall icu_63::MessagePattern::hashCode(MessagePattern *this)

{
  UMessagePatternApostropheMode UVar1;
  int32_t iVar2;
  int local_18;
  int local_14;
  int32_t i;
  int32_t hash;
  MessagePattern *this_local;
  
  UVar1 = this->aposMode;
  iVar2 = UnicodeString::hashCode(&this->msg);
  local_14 = (UVar1 * 0x25 + iVar2) * 0x25 + this->partsLength;
  for (local_18 = 0; local_18 < this->partsLength; local_18 = local_18 + 1) {
    iVar2 = Part::hashCode(this->parts + local_18);
    local_14 = local_14 * 0x25 + iVar2;
  }
  return local_14;
}

Assistant:

int32_t
MessagePattern::hashCode() const {
    int32_t hash=(aposMode*37+msg.hashCode())*37+partsLength;
    for(int32_t i=0; i<partsLength; ++i) {
        hash=hash*37+parts[i].hashCode();
    }
    return hash;
}